

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ParseMatrix(AsciiParser *this,matrix2d *result)

{
  char cVar1;
  bool bVar2;
  long *plVar3;
  ulong uVar4;
  long *plVar5;
  size_type *psVar6;
  char cVar7;
  ulong __val;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> content;
  string __str;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  long *local_48;
  uint local_40;
  long local_38 [2];
  
  bVar2 = Expect(this,'(');
  if (!bVar2) {
    return false;
  }
  local_a8.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = SepBy1TupleType<double,2ul>(this,',',&local_a8);
  if (bVar2) {
    if ((long)local_a8.
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_a8.
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20) {
      bVar2 = Expect(this,')');
      if (bVar2) {
        result->m[0][0] =
             (local_a8.
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0];
        result->m[0][1] =
             (local_a8.
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_elems[1];
        result->m[1][0] =
             local_a8.
             super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start[1]._M_elems[0];
        result->m[1][1] =
             local_a8.
             super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start[1]._M_elems[1];
        bVar2 = true;
        goto LAB_0036e291;
      }
    }
    else {
      __val = (long)local_a8.
                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_a8.
                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      cVar7 = '\x01';
      if (9 < __val) {
        uVar4 = __val;
        cVar1 = '\x04';
        do {
          cVar7 = cVar1;
          if (uVar4 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_0036e154;
          }
          if (uVar4 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_0036e154;
          }
          if (uVar4 < 10000) goto LAB_0036e154;
          bVar2 = 99999 < uVar4;
          uVar4 = uVar4 / 10000;
          cVar1 = cVar7 + '\x04';
        } while (bVar2);
        cVar7 = cVar7 + '\x01';
      }
LAB_0036e154:
      local_48 = local_38;
      ::std::__cxx11::string::_M_construct((ulong)&local_48,cVar7);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_48,local_40,__val);
      plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x3b106e);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_78 = *plVar5;
        lStack_70 = plVar3[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar5;
        local_88 = (long *)*plVar3;
      }
      local_80 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)::std::__cxx11::string::append((char *)&local_88);
      psVar6 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_68.field_2._M_allocated_capacity = *psVar6;
        local_68.field_2._8_8_ = plVar3[3];
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar6;
        local_68._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_68._M_string_length = plVar3[1];
      *plVar3 = (long)psVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      PushError(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,local_78 + 1);
      }
      if (local_48 != local_38) {
        operator_delete(local_48,local_38[0] + 1);
      }
    }
  }
  bVar2 = false;
  if (local_a8.
      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl
      .super__Vector_impl_data._M_start == (pointer)0x0) {
    return false;
  }
LAB_0036e291:
  operator_delete(local_a8.
                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)local_a8.
                        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_a8.
                        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  return bVar2;
}

Assistant:

bool AsciiParser::ParseMatrix(value::matrix2d *result) {

  if (!Expect('(')) {
    return false;
  }

  std::vector<std::array<double, 2>> content;
  if (!SepBy1TupleType<double, 2>(',', &content)) {
    return false;
  }

  if (content.size() != 2) {
    PushError("# of rows in matrix2d must be 2, but got " +
              std::to_string(content.size()) + "\n");
    return false;
  }

  if (!Expect(')')) {
    return false;
  }

  for (size_t i = 0; i < 2; i++) {
    result->m[i][0] = content[i][0];
    result->m[i][1] = content[i][1];
  }

  return true;
}